

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O1

Expression * wasm::fromABI(Expression *value,Type type,Module *module)

{
  Unary *this;
  Unary *this_00;
  
  if (6 < type.id) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  this_00 = (Unary *)value;
  switch(type.id & 0xffffffff) {
  case 0:
    this_00 = (Unary *)MixedArena::allocSpace(&module->allocator,0x18,8);
    (((SpecificExpression<(wasm::Expression::Id)18> *)
     &this_00->super_SpecificExpression<(wasm::Expression::Id)15>)->super_Expression)._id = DropId;
    (((SpecificExpression<(wasm::Expression::Id)18> *)
     &this_00->super_SpecificExpression<(wasm::Expression::Id)15>)->super_Expression).type.id = 0;
    *(Expression **)&this_00->op = value;
    Drop::finalize((Drop *)this_00);
    break;
  case 2:
    this_00 = (Unary *)MixedArena::allocSpace(&module->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    this_00->op = WrapInt64;
    goto LAB_006f8e6d;
  case 4:
    this = (Unary *)MixedArena::allocSpace(&module->allocator,0x20,8);
    (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    this->op = WrapInt64;
    this->value = value;
    Unary::finalize(this);
    this_00 = (Unary *)MixedArena::allocSpace(&module->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    this_00->op = ReinterpretInt32;
    this_00->value = (Expression *)this;
    Unary::finalize(this_00);
    break;
  case 5:
    this_00 = (Unary *)MixedArena::allocSpace(&module->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    this_00->op = ReinterpretInt64;
LAB_006f8e6d:
    this_00->value = value;
    Unary::finalize(this_00);
    break;
  case 6:
    handle_unreachable("v128 not implemented yet",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/FuncCastEmulation.cpp"
                       ,0x65);
  }
  return (Expression *)this_00;
}

Assistant:

static Expression* fromABI(Expression* value, Type type, Module* module) {
  Builder builder(*module);
  switch (type.getBasic()) {
    case Type::i32: {
      value = builder.makeUnary(WrapInt64, value);
      break;
    }
    case Type::i64: {
      // already good
      break;
    }
    case Type::f32: {
      value = builder.makeUnary(ReinterpretInt32,
                                builder.makeUnary(WrapInt64, value));
      break;
    }
    case Type::f64: {
      value = builder.makeUnary(ReinterpretInt64, value);
      break;
    }
    case Type::v128: {
      WASM_UNREACHABLE("v128 not implemented yet");
    }
    case Type::none: {
      value = builder.makeDrop(value);
      break;
    }
    case Type::unreachable: {
      // can leave it, the call isn't taken anyhow
      break;
    }
  }
  return value;
}